

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O0

double permutations(int32_t a,int32_t b)

{
  int iVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  int32_t local_10;
  int32_t local_c;
  int32_t b_local;
  int32_t a_local;
  
  local_10 = b;
  local_c = a;
  if (a < b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers."
               ,&local_31);
    error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  iVar1 = factorial(local_c);
  iVar2 = factorial(local_c - local_10);
  return (double)iVar1 / (double)iVar2;
}

Assistant:

double permutations(int32_t a, int32_t b)
{
	if (a < b)
		error(
			"Permutation formula is: P(a,b) = a! / (a - b)!\nDifference (a - b) in denominator must be greater or equal to zero. Factorial is not defined for negative numbers.");
	return double(factorial(a)) / factorial(a - b);
}